

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O0

void __thiscall asio::detail::thread_group::join(thread_group *this)

{
  item *this_00;
  item *tmp;
  thread_group *this_local;
  
  while (*(long *)this != 0) {
    posix_thread::join(*(posix_thread **)this);
    this_00 = *(item **)this;
    *(undefined8 *)this = *(undefined8 *)(*(long *)this + 0x10);
    if (this_00 != (item *)0x0) {
      item::~item(this_00);
      operator_delete(this_00,0x18);
    }
  }
  return;
}

Assistant:

void join()
  {
    while (first_)
    {
      first_->thread_.join();
      item* tmp = first_;
      first_ = first_->next_;
      delete tmp;
    }
  }